

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

void __thiscall llvm::APInt::ashrInPlace(APInt *this,uint ShiftAmt)

{
  bool bVar1;
  int64_t iVar2;
  int64_t SExtVAL;
  uint ShiftAmt_local;
  APInt *this_local;
  
  if (this->BitWidth < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x3ba,"void llvm::APInt::ashrInPlace(unsigned int)");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    iVar2 = SignExtend64((this->U).VAL,this->BitWidth);
    if (ShiftAmt == this->BitWidth) {
      (this->U).VAL = iVar2 >> 0x3f;
    }
    else {
      (this->U).VAL = iVar2 >> ((byte)ShiftAmt & 0x3f);
    }
    clearUnusedBits(this);
  }
  else {
    ashrSlowCase(this,ShiftAmt);
  }
  return;
}

Assistant:

void ashrInPlace(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      int64_t SExtVAL = SignExtend64(U.VAL, BitWidth);
      if (ShiftAmt == BitWidth)
        U.VAL = SExtVAL >> (APINT_BITS_PER_WORD - 1); // Fill with sign bit.
      else
        U.VAL = SExtVAL >> ShiftAmt;
      clearUnusedBits();
      return;
    }
    ashrSlowCase(ShiftAmt);
  }